

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# whitelist_impl.h
# Opt level: O1

int secp256k1_whitelist_hash_pubkey(secp256k1_scalar *output,secp256k1_gej *pubkey)

{
  int iVar1;
  int iVar2;
  int overflow;
  size_t size;
  uchar c [33];
  secp256k1_sha256 sha;
  uchar h [32];
  secp256k1_ge ge;
  int local_134;
  size_t local_130;
  uchar local_128 [40];
  secp256k1_sha256 local_100;
  uchar local_98 [40];
  secp256k1_ge local_70;
  
  local_134 = 0;
  local_130 = 0x21;
  secp256k1_ge_set_gej(&local_70,pubkey);
  local_100.s[0] = 0x6a09e667;
  local_100.s[1] = 0xbb67ae85;
  local_100.s[2] = 0x3c6ef372;
  local_100.s[3] = 0xa54ff53a;
  local_100.s[4] = 0x510e527f;
  local_100.s[5] = 0x9b05688c;
  local_100.s[6] = 0x1f83d9ab;
  local_100.s[7] = 0x5be0cd19;
  local_100.bytes = 0;
  iVar1 = secp256k1_eckey_pubkey_serialize(&local_70,local_128,&local_130,0x102);
  iVar2 = 0;
  if (iVar1 != 0) {
    secp256k1_sha256_write(&local_100,local_128,local_130);
    secp256k1_sha256_finalize(&local_100,local_98);
    secp256k1_scalar_set_b32(output,local_98,&local_134);
    if ((local_134 != 0) ||
       (iVar2 = 1,
       ((output->d[1] == 0 && output->d[0] == 0) && output->d[2] == 0) && output->d[3] == 0)) {
      output->d[2] = 0;
      output->d[3] = 0;
      output->d[0] = 0;
      output->d[1] = 0;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

static int secp256k1_whitelist_hash_pubkey(secp256k1_scalar* output, secp256k1_gej* pubkey) {
    unsigned char h[32];
    unsigned char c[33];
    secp256k1_sha256 sha;
    int overflow = 0;
    size_t size = 33;
    secp256k1_ge ge;

    secp256k1_ge_set_gej(&ge, pubkey);

    secp256k1_sha256_initialize(&sha);
    if (!secp256k1_eckey_pubkey_serialize(&ge, c, &size, SECP256K1_EC_COMPRESSED)) {
        return 0;
    }
    secp256k1_sha256_write(&sha, c, size);
    secp256k1_sha256_finalize(&sha, h);

    secp256k1_scalar_set_b32(output, h, &overflow);
    if (overflow || secp256k1_scalar_is_zero(output)) {
        /* This return path is mathematically impossible to hit */
        secp256k1_scalar_clear(output);
        return 0;
    }
    return 1;
}